

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

void __thiscall
dxil_spv::Converter::Impl::repack_sparse_feedback
          (Impl *this,ComponentType component_type,uint num_components,Value *value,
          Type *target_type,Id override_value)

{
  Id IVar1;
  Builder *this_00;
  Operation *pOVar2;
  Type *type;
  Id *comp_1;
  Id *__end1;
  Id *__begin1;
  Id (*__range1) [5];
  Operation *repack_op;
  Id *comp;
  Id *__end2;
  Id *__begin2;
  Id (*__range2) [5];
  Operation *extract_op;
  Id local_68;
  uint i;
  Id components [5];
  Operation *texel;
  Id texel_id;
  ComponentType effective_component_type;
  Operation *code_id;
  Type *pTStack_28;
  Id override_value_local;
  Type *target_type_local;
  Value *value_local;
  uint num_components_local;
  ComponentType component_type_local;
  Impl *this_local;
  
  code_id._4_4_ = override_value;
  pTStack_28 = target_type;
  target_type_local = (Type *)value;
  value_local._0_4_ = num_components;
  value_local._7_1_ = component_type;
  _num_components_local = this;
  this_00 = builder(this);
  IVar1 = spv::Builder::makeUintType(this_00,0x20);
  pOVar2 = allocate(this,OpCompositeExtract,IVar1);
  _texel_id = pOVar2;
  IVar1 = get_id_for_value(this,(Value *)target_type_local,0);
  Operation::add_id(pOVar2,IVar1);
  Operation::add_literal(_texel_id,0);
  add(this,_texel_id,false);
  texel._7_1_ = get_effective_typed_resource_type(value_local._7_1_);
  if (code_id._4_4_ == 0) {
    IVar1 = get_type_id(this,texel._7_1_,1,(uint)value_local,false);
    pOVar2 = allocate(this,OpCompositeExtract,IVar1);
    IVar1 = get_id_for_value(this,(Value *)target_type_local,0);
    Operation::add_id(pOVar2,IVar1);
    Operation::add_literal(pOVar2,1);
    add(this,pOVar2,false);
    texel._0_4_ = pOVar2->id;
  }
  else {
    texel._0_4_ = code_id._4_4_;
  }
  fixup_load_type_typed
            (this,(ComponentType *)((long)&value_local + 7),(uint)value_local,(Id *)&texel,
             pTStack_28);
  if ((uint)value_local < 2) {
    for (__end2 = &local_68; __end2 != components + 3; __end2 = __end2 + 1) {
      *__end2 = (Id)texel;
    }
    value_local._0_4_ = 4;
  }
  else {
    for (extract_op._4_4_ = 0; extract_op._4_4_ < (uint)value_local;
        extract_op._4_4_ = extract_op._4_4_ + 1) {
      IVar1 = get_type_id(this,value_local._7_1_,1,1,false);
      pOVar2 = allocate(this,OpCompositeExtract,IVar1);
      Operation::add_id(pOVar2,(Id)texel);
      Operation::add_literal(pOVar2,extract_op._4_4_);
      add(this,pOVar2,false);
      (&local_68)[extract_op._4_4_] = pOVar2->id;
    }
  }
  (&local_68)[(uint)value_local] = _texel_id->id;
  type = LLVMBC::Value::getType((Value *)target_type_local);
  IVar1 = get_type_id(this,type,0);
  pOVar2 = allocate(this,OpCompositeConstruct,IVar1);
  for (__end1 = &local_68; __end1 != components + 3; __end1 = __end1 + 1) {
    Operation::add_id(pOVar2,*__end1);
  }
  add(this,pOVar2,false);
  rewrite_value(this,(Value *)target_type_local,pOVar2->id);
  return;
}

Assistant:

void Converter::Impl::repack_sparse_feedback(DXIL::ComponentType component_type, unsigned num_components, const llvm::Value *value,
                                             const llvm::Type *target_type, spv::Id override_value)
{
	auto *code_id = allocate(spv::OpCompositeExtract, builder().makeUintType(32));
	code_id->add_id(get_id_for_value(value));
	code_id->add_literal(0);
	add(code_id);

	auto effective_component_type = get_effective_typed_resource_type(component_type);
	spv::Id texel_id;

	if (override_value)
	{
		texel_id = override_value;
	}
	else
	{
		auto *texel = allocate(spv::OpCompositeExtract, get_type_id(effective_component_type, 1, num_components));
		texel->add_id(get_id_for_value(value));
		texel->add_literal(1);
		add(texel);
		texel_id = texel->id;
	}

	fixup_load_type_typed(component_type, num_components, texel_id, target_type);

	spv::Id components[5];

	if (num_components > 1)
	{
		for (unsigned i = 0; i < num_components; i++)
		{
			auto *extract_op = allocate(spv::OpCompositeExtract, get_type_id(component_type, 1, 1));
			extract_op->add_id(texel_id);
			extract_op->add_literal(i);
			add(extract_op);
			components[i] = extract_op->id;
		}
	}
	else
	{
		for (auto &comp : components)
			comp = texel_id;
		num_components = 4;
	}

	components[num_components] = code_id->id;

	auto *repack_op = allocate(spv::OpCompositeConstruct, get_type_id(value->getType()));
	for (auto &comp : components)
		repack_op->add_id(comp);
	add(repack_op);
	rewrite_value(value, repack_op->id);
}